

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.hpp
# Opt level: O0

string * vkt::SpirVAssembly::numberToString<float>(string *__return_storage_ptr__,float number)

{
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [380];
  float local_14;
  string *psStack_10;
  float number_local;
  
  local_14 = number;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,local_14);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

const std::string numberToString (T number)
{
	std::stringstream ss;
	ss << number;
	return ss.str();
}